

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

StackSym * __thiscall Func::CreateInlineeStackSym(Func *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  
  bVar3 = IsInlinee(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x5af,"(IsInlinee())","IsInlinee()");
    if (!bVar3) goto LAB_0042f372;
    *puVar4 = 0;
  }
  if (this->m_inlineeFrameStartSym->m_offset == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x5b0,"(m_inlineeFrameStartSym->m_offset != -1)",
                       "m_inlineeFrameStartSym->m_offset != -1");
    if (!bVar3) {
LAB_0042f372:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = SymTable::GetArgSlotSym(this->m_symTable,0xffff);
  uVar1 = *(uint *)&pSVar5->field_0x18;
  *(uint *)&pSVar5->field_0x18 = uVar1 | 0x4000;
  pSVar5->m_offset = this->m_inlineeFrameStartSym->m_offset;
  *(uint *)&pSVar5->field_0x18 = uVar1 | 0x5000;
  return pSVar5;
}

Assistant:

StackSym *
Func::CreateInlineeStackSym()
{
    // Make sure this is an inlinee and that GlobOpt has initialized the offset
    // in the inlinee's frame.
    Assert(IsInlinee());
    Assert(m_inlineeFrameStartSym->m_offset != -1);

    StackSym *stackSym = m_symTable->GetArgSlotSym((Js::ArgSlot)-1);
    stackSym->m_isInlinedArgSlot = true;
    stackSym->m_offset = m_inlineeFrameStartSym->m_offset;
    stackSym->m_allocated = true;

    return stackSym;
}